

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cc
# Opt level: O3

void brotli::ZopfliIterate
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               size_t max_backward_limit,ZopfliCostModel *model,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *num_matches,
               vector<brotli::BackwardMatch,_std::allocator<brotli::BackwardMatch>_> *matches,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  uint uVar1;
  uint uVar2;
  unsigned_long uVar3;
  BackwardMatch BVar4;
  undefined8 uVar5;
  pointer pZVar6;
  size_t sVar7;
  size_t length_code;
  pointer puVar8;
  double *pdVar9;
  int *piVar10;
  size_t pos;
  size_type sVar11;
  long lVar12;
  uint8_t *puVar13;
  uint uVar14;
  size_t insert_length;
  ulong uVar15;
  ulong uVar16;
  Command *pCVar17;
  ulong uVar18;
  size_t dist_code;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  size_t sVar22;
  long lVar23;
  double dVar24;
  vector<unsigned_int,_std::allocator<unsigned_int>_> backwards;
  vector<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_> nodes;
  Command cmd;
  uint *local_198;
  iterator iStack_190;
  uint *local_188;
  size_t local_178;
  ulong local_170;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_168;
  vector<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_> local_148;
  StartPosQueue local_130;
  size_t local_108;
  size_t local_100;
  ulong local_f8;
  uint8_t *local_f0;
  uint8_t *local_e8;
  long local_e0;
  double local_d8;
  size_type local_d0;
  uint8_t *local_c8;
  ulong local_c0;
  ulong local_b8;
  ZopfliCostModel *local_b0;
  double local_a8;
  size_t local_a0;
  long local_98;
  size_t local_90;
  ulong local_88;
  ulong local_80;
  long local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  BackwardMatch local_58;
  ulong local_50;
  Command local_48;
  
  local_d0 = num_bytes + 1;
  local_178 = ringbuffer_mask;
  local_108 = position;
  local_100 = max_backward_limit;
  local_e8 = ringbuffer;
  std::vector<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>::vector
            (&local_148,local_d0,(allocator_type *)&local_130);
  (local_148.super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>._M_impl.
   super__Vector_impl_data._M_start)->length = 0;
  (local_148.super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>._M_impl.
   super__Vector_impl_data._M_start)->cost = 0.0;
  uVar5 = *(undefined8 *)(dist_cache + 2);
  *(undefined8 *)
   (local_148.super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>._M_impl.
    super__Vector_impl_data._M_start)->distance_cache = *(undefined8 *)dist_cache;
  *(undefined8 *)
   ((local_148.super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>._M_impl.
     super__Vector_impl_data._M_start)->distance_cache + 2) = uVar5;
  local_130.mask_ = 7;
  local_130.q_.
  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x80);
  local_130.q_.
  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_130.q_.
       super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
       ._M_impl.super__Vector_impl_data._M_start + 8;
  local_130.q_.
  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_start[7].first = 0;
  local_130.q_.
  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_start[7].second = 0.0;
  local_130.q_.
  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_start[6].first = 0;
  local_130.q_.
  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_start[6].second = 0.0;
  local_130.q_.
  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_start[5].first = 0;
  local_130.q_.
  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_start[5].second = 0.0;
  local_130.q_.
  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_start[4].first = 0;
  local_130.q_.
  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_start[4].second = 0.0;
  local_130.q_.
  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_start[3].first = 0;
  local_130.q_.
  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_start[3].second = 0.0;
  local_130.q_.
  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_start[2].first = 0;
  local_130.q_.
  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_start[2].second = 0.0;
  local_130.q_.
  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_start[1].first = 0;
  local_130.q_.
  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_start[1].second = 0.0;
  (local_130.q_.
   super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
   ._M_impl.super__Vector_impl_data._M_start)->first = 0;
  (local_130.q_.
   super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
   ._M_impl.super__Vector_impl_data._M_start)->second = 0.0;
  local_130.idx_ = 0;
  local_130.q_.
  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_130.q_.
       super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (3 < num_bytes) {
    local_a8 = model->min_cost_cmd_;
    lVar12 = 0;
    pos = 0;
    local_b0 = model;
    do {
      uVar21 = local_108 + pos;
      sVar7 = local_100;
      if (uVar21 < local_100) {
        sVar7 = uVar21;
      }
      pdVar9 = (model->literal_costs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      StartPosQueue::Push(&local_130,pos,
                          local_148.
                          super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                          ._M_impl.super__Vector_impl_data._M_start[pos].cost -
                          (pdVar9[pos] - *pdVar9));
      model = local_b0;
      sVar22 = local_178;
      uVar19 = uVar21 & local_178;
      uVar20 = num_bytes - pos;
      local_60 = uVar21;
      local_a0 = ComputeMinimumCopyLength(&local_130,&local_148,local_b0,pos,local_a8);
      local_90 = local_a0 - 1;
      local_f0 = local_e8 + uVar19;
      local_b8 = uVar20 >> 3;
      local_c0 = uVar20 & 0xfffffffffffffff8;
      local_c8 = local_f0 + local_c0;
      local_f8 = (ulong)((uint)uVar20 & 7);
      local_98 = pos * 0x30 + 0x58;
      local_78 = pos * 0x30 + 0x28;
      uVar21 = 0;
      local_e0 = lVar12;
      local_80 = uVar20;
      local_68 = uVar19;
      do {
        pZVar6 = local_148.
                 super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>._M_impl
                 .super__Vector_impl_data._M_start;
        uVar19 = local_130.mask_ + 1;
        if (local_130.idx_ <= local_130.mask_ + 1) {
          uVar19 = local_130.idx_;
        }
        if (uVar19 <= uVar21) break;
        local_88 = uVar21 + 1;
        uVar3 = local_130.q_.
                super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_start
                [local_88 - local_130.idx_ & local_130.mask_].first;
        piVar10 = local_148.
                  super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar3].distance_cache;
        pdVar9 = (model->literal_costs_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                 .super__Vector_impl_data._M_start;
        local_d8 = local_148.
                   super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar3].cost - (pdVar9[uVar3] - *pdVar9);
        insert_length = pos - uVar3;
        dist_code = 0;
        length_code = local_90;
        local_170 = uVar21;
        do {
          uVar21 = (long)(int)(&kDistanceCacheOffset)[dist_code] +
                   (long)piVar10[(uint)(&kDistanceCacheIndex)[dist_code]];
          if (((uVar21 <= sVar7) && (local_60 - uVar21 < local_60)) &&
             (local_68 + length_code <= sVar22)) {
            uVar19 = local_60 - uVar21 & sVar22;
            if ((uVar19 + length_code <= sVar22) &&
               (local_e8[local_68 + length_code] == local_e8[uVar19 + length_code])) {
              if (7 < local_80) {
                lVar12 = 0;
                uVar20 = 0;
LAB_00168406:
                if (*(ulong *)(local_f0 + uVar20 * 8) == *(ulong *)(local_e8 + uVar20 * 8 + uVar19))
                goto code_r0x0016841b;
                uVar20 = *(ulong *)(local_e8 + uVar20 * 8 + uVar19) ^
                         *(ulong *)(local_f0 + uVar20 * 8);
                uVar19 = 0;
                if (uVar20 != 0) {
                  for (; (uVar20 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                  }
                }
                uVar20 = (uVar19 >> 3 & 0x1fffffff) - lVar12;
                goto LAB_0016844e;
              }
              puVar13 = local_f0;
              uVar15 = 0;
LAB_00168548:
              uVar20 = uVar15;
              if (local_f8 != 0) {
                uVar16 = uVar15 | local_f8;
                uVar18 = local_f8;
                do {
                  uVar20 = uVar15;
                  if (local_e8[uVar15 + uVar19] != *puVar13) break;
                  puVar13 = puVar13 + 1;
                  uVar15 = uVar15 + 1;
                  uVar18 = uVar18 - 1;
                  uVar20 = uVar16;
                } while (uVar18 != 0);
              }
LAB_0016844e:
              sVar22 = local_178;
              if (length_code + 1 <= uVar20) {
                lVar12 = length_code * 0x30 + local_98;
                uVar19 = length_code + 1;
                do {
                  length_code = uVar19;
                  dVar24 = ZopfliCostModel::GetCommandCost
                                     (model,dist_code,length_code,insert_length);
                  pdVar9 = (model->literal_costs_).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  dVar24 = (pdVar9[pos] - *pdVar9) + dVar24 + local_d8;
                  if (dVar24 < *(double *)
                                ((long)(local_148.
                                        super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->distance_cache +
                                lVar12 + -0xc)) {
                    *(int *)((long)(local_148.
                                    super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->distance_cache +
                            lVar12 + -0x34) = (int)length_code;
                    *(int *)((long)(local_148.
                                    super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->distance_cache +
                            lVar12 + -0x18) = (int)length_code;
                    *(int *)((long)(local_148.
                                    super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->distance_cache +
                            lVar12 + -0x30) = (int)uVar21;
                    *(int *)((long)(local_148.
                                    super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->distance_cache +
                            lVar12 + -0x2c) = (int)dist_code;
                    *(int *)((long)(local_148.
                                    super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->distance_cache +
                            lVar12 + -0x14) = (int)insert_length;
                    *(double *)
                     ((long)(local_148.
                             super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                             ._M_impl.super__Vector_impl_data._M_start)->distance_cache +
                     lVar12 + -0xc) = dVar24;
                    if (dist_code == 0) {
                      uVar5 = *(undefined8 *)(pZVar6[uVar3].distance_cache + 2);
                      *(undefined8 *)
                       ((long)(local_148.
                               super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                               ._M_impl.super__Vector_impl_data._M_start)->distance_cache +
                       lVar12 + -0x28) = *(undefined8 *)piVar10;
                      *(undefined8 *)
                       ((long)(local_148.
                               super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                               ._M_impl.super__Vector_impl_data._M_start)->distance_cache +
                       lVar12 + -0x20) = uVar5;
                    }
                    else {
                      *(int *)((long)(local_148.
                                      super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->distance_cache +
                              lVar12 + -0x28) = (int)uVar21;
                      *(undefined8 *)
                       ((long)(local_148.
                               super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                               ._M_impl.super__Vector_impl_data._M_start)->distance_cache +
                       lVar12 + -0x24) = *(undefined8 *)piVar10;
                      *(int *)((long)(local_148.
                                      super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->distance_cache +
                              lVar12 + -0x1c) = pZVar6[uVar3].distance_cache[2];
                    }
                  }
                  lVar12 = lVar12 + 0x30;
                  uVar19 = length_code + 1;
                  sVar22 = local_178;
                } while (length_code + 1 <= uVar20);
              }
            }
          }
          dist_code = dist_code + 1;
        } while (dist_code != 0x10);
        lVar12 = local_e0;
        if ((local_170 < 2) &&
           (puVar8 = (num_matches->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_start, puVar8[pos] != 0)) {
          uVar21 = 0;
          uVar19 = local_a0;
          do {
            BVar4 = (matches->
                    super__Vector_base<brotli::BackwardMatch,_std::allocator<brotli::BackwardMatch>_>
                    )._M_impl.super__Vector_impl_data._M_start[lVar12 + uVar21];
            uVar15 = (ulong)BVar4 >> 0x25;
            uVar20 = uVar15;
            if (uVar15 < uVar19) {
              uVar20 = uVar19;
            }
            uVar18 = (ulong)BVar4 & 0xffffffff;
            if (sVar7 < uVar18) {
              uVar19 = uVar20;
            }
            if (0xa2 < BVar4.length_and_code >> 6) {
              uVar19 = uVar20;
            }
            if (uVar19 <= uVar15) {
              local_170 = uVar18 + 0xf;
              local_50 = (ulong)(BVar4.length_and_code & 0x1f);
              if (((ulong)BVar4 & 0x1f00000000) == 0) {
                local_50 = uVar15;
              }
              lVar12 = uVar19 * 0x30 + local_78;
              local_70 = uVar21;
              local_58 = BVar4;
              do {
                uVar21 = uVar19;
                if (sVar7 < uVar18) {
                  uVar21 = local_50;
                }
                dVar24 = ZopfliCostModel::GetCommandCost(model,local_170,uVar21,insert_length);
                pdVar9 = (model->literal_costs_).super__Vector_base<double,_std::allocator<double>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                dVar24 = (pdVar9[pos] - *pdVar9) + dVar24 + local_d8;
                if (dVar24 < *(double *)
                              ((long)(local_148.
                                      super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->distance_cache +
                              lVar12 + -0xc)) {
                  *(int *)((long)(local_148.
                                  super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->distance_cache +
                          lVar12 + -0x34) = (int)uVar19;
                  *(int *)((long)(local_148.
                                  super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->distance_cache +
                          lVar12 + -0x18) = (int)uVar21;
                  *(uint32_t *)
                   ((long)(local_148.
                           super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                           ._M_impl.super__Vector_impl_data._M_start)->distance_cache +
                   lVar12 + -0x30) = local_58.distance;
                  *(int *)((long)(local_148.
                                  super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->distance_cache +
                          lVar12 + -0x2c) = (int)local_170;
                  *(int *)((long)(local_148.
                                  super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->distance_cache +
                          lVar12 + -0x14) = (int)insert_length;
                  *(double *)
                   ((long)(local_148.
                           super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                           ._M_impl.super__Vector_impl_data._M_start)->distance_cache +
                   lVar12 + -0xc) = dVar24;
                  if (sVar7 < uVar18) {
                    uVar5 = *(undefined8 *)(pZVar6[uVar3].distance_cache + 2);
                    *(undefined8 *)
                     ((long)(local_148.
                             super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                             ._M_impl.super__Vector_impl_data._M_start)->distance_cache +
                     lVar12 + -0x28) = *(undefined8 *)piVar10;
                    *(undefined8 *)
                     ((long)(local_148.
                             super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                             ._M_impl.super__Vector_impl_data._M_start)->distance_cache +
                     lVar12 + -0x20) = uVar5;
                  }
                  else {
                    *(uint32_t *)
                     ((long)(local_148.
                             super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                             ._M_impl.super__Vector_impl_data._M_start)->distance_cache +
                     lVar12 + -0x28) = local_58.distance;
                    *(undefined8 *)
                     ((long)(local_148.
                             super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                             ._M_impl.super__Vector_impl_data._M_start)->distance_cache +
                     lVar12 + -0x24) = *(undefined8 *)piVar10;
                    *(int *)((long)(local_148.
                                    super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->distance_cache +
                            lVar12 + -0x1c) = pZVar6[uVar3].distance_cache[2];
                  }
                }
                uVar19 = uVar19 + 1;
                lVar12 = lVar12 + 0x30;
              } while (uVar15 + 1 != uVar19);
              puVar8 = (num_matches->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              uVar21 = local_70;
              lVar12 = local_e0;
              uVar19 = uVar15 + 1;
              sVar22 = local_178;
            }
            uVar21 = uVar21 + 1;
          } while (uVar21 < puVar8[pos]);
        }
        uVar21 = local_88;
      } while (local_88 != 5);
      uVar21 = (ulong)(num_matches->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                      ._M_impl.super__Vector_impl_data._M_start[pos];
      lVar12 = lVar12 + uVar21;
      if ((uVar21 == 1) &&
         (uVar14 = (matches->
                   super__Vector_base<brotli::BackwardMatch,_std::allocator<brotli::BackwardMatch>_>
                   )._M_impl.super__Vector_impl_data._M_start[lVar12 + -1].length_and_code,
         0x28bf < uVar14)) {
        pos = (pos + (uVar14 >> 5)) - 1;
        local_130.idx_ = 0;
      }
      uVar21 = pos + 4;
      pos = pos + 1;
    } while (uVar21 < num_bytes);
  }
  local_168.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_168.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  pdVar9 = &local_148.super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>.
            _M_impl.super__Vector_impl_data._M_start[num_bytes].cost;
  sVar11 = local_d0;
  do {
    dVar24 = *pdVar9;
    sVar11 = sVar11 - 1;
    pdVar9 = pdVar9 + -6;
  } while (INFINITY <= dVar24);
  pCVar17 = commands;
  if (sVar11 == 0) {
    local_198 = (uint *)0x0;
    iStack_190._M_current = (uint *)0x0;
    local_188 = (uint *)0x0;
    lVar12 = 0;
  }
  else {
    do {
      uVar14 = local_148.super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
               ._M_impl.super__Vector_impl_data._M_start[sVar11].insert_length +
               local_148.super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
               ._M_impl.super__Vector_impl_data._M_start[sVar11].length;
      local_198 = (uint *)CONCAT44(local_198._4_4_,uVar14);
      if (local_168.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_168.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (&local_168,
                   (iterator)
                   local_168.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish,(uint *)&local_198);
      }
      else {
        *local_168.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish = uVar14;
        local_168.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_168.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      sVar11 = sVar11 - uVar14;
    } while (sVar11 != 0);
    local_198 = (uint *)0x0;
    iStack_190._M_current = (uint *)0x0;
    local_188 = (uint *)0x0;
    lVar12 = (long)local_168.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)local_168.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_start;
    if (lVar12 != 0) {
      lVar23 = lVar12 >> 2;
      do {
        lVar12 = lVar12 + -4;
        if (iStack_190._M_current == local_188) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_198,iStack_190,
                     (uint *)((long)local_168.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start + lVar12));
        }
        else {
          *iStack_190._M_current =
               *(uint *)((long)local_168.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar12);
          iStack_190._M_current = iStack_190._M_current + 1;
        }
        lVar23 = lVar23 + -1;
      } while (lVar23 != 0);
      if (iStack_190._M_current != local_198) {
        uVar21 = 0;
        lVar12 = 0;
        do {
          uVar20 = (ulong)local_198[uVar21];
          uVar14 = local_148.
                   super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>.
                   _M_impl.super__Vector_impl_data._M_start[lVar12 + uVar20].length;
          uVar15 = (ulong)local_148.
                          super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar12 + uVar20].insert_length;
          uVar19 = uVar15;
          if (uVar21 == 0) {
            uVar19 = *last_insert_len + uVar15;
            *last_insert_len = 0;
          }
          uVar1 = local_148.
                  super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>.
                  _M_impl.super__Vector_impl_data._M_start[lVar12 + uVar20].distance;
          uVar2 = local_148.
                  super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>.
                  _M_impl.super__Vector_impl_data._M_start[lVar12 + uVar20].distance_code;
          Command::Command(&local_48,uVar19,(ulong)uVar14,
                           (ulong)local_148.
                                  super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                                  ._M_impl.super__Vector_impl_data._M_start[lVar12 + uVar20].
                                  length_code,(ulong)uVar2);
          uVar20 = local_108 + lVar12 + uVar15;
          if (local_100 <= uVar20) {
            uVar20 = local_100;
          }
          pCVar17->dist_extra_ = local_48.dist_extra_;
          pCVar17->cmd_prefix_ = local_48.cmd_prefix_;
          pCVar17->dist_prefix_ = local_48.dist_prefix_;
          pCVar17->insert_len_ = local_48.insert_len_;
          pCVar17->copy_len_ = local_48.copy_len_;
          pCVar17->cmd_extra_ = local_48.cmd_extra_;
          if ((uVar1 <= uVar20) && (uVar2 != 0)) {
            dist_cache[3] = dist_cache[2];
            *(undefined8 *)(dist_cache + 1) = *(undefined8 *)dist_cache;
            *dist_cache = uVar1;
          }
          *num_literals = *num_literals + uVar19;
          pCVar17 = pCVar17 + 1;
          lVar12 = lVar12 + uVar15 + (ulong)uVar14;
          uVar21 = uVar21 + 1;
        } while (uVar21 < (ulong)((long)iStack_190._M_current - (long)local_198 >> 2));
        goto LAB_00168a80;
      }
    }
    lVar12 = 0;
  }
LAB_00168a80:
  *last_insert_len = *last_insert_len + (num_bytes - lVar12);
  *num_commands = *num_commands + ((long)pCVar17 - (long)commands >> 3) * -0x5555555555555555;
  if (local_198 != (uint *)0x0) {
    operator_delete(local_198,(long)local_188 - (long)local_198);
  }
  if (local_168.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_168.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_168.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_130.q_.
      super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_130.q_.
                    super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_130.q_.
                          super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_130.q_.
                          super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_148.super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.
                    super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_148.
                          super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.
                          super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
code_r0x0016841b:
  uVar20 = uVar20 + 1;
  lVar12 = lVar12 + -8;
  puVar13 = local_c8;
  uVar15 = local_c0;
  if (local_b8 == uVar20) goto LAB_00168548;
  goto LAB_00168406;
}

Assistant:

void ZopfliIterate(size_t num_bytes,
                   size_t position,
                   const uint8_t* ringbuffer,
                   size_t ringbuffer_mask,
                   const size_t max_backward_limit,
                   const ZopfliCostModel& model,
                   const std::vector<uint32_t>& num_matches,
                   const std::vector<BackwardMatch>& matches,
                   int* dist_cache,
                   size_t* last_insert_len,
                   Command* commands,
                   size_t* num_commands,
                   size_t* num_literals) {
  const Command * const orig_commands = commands;

  std::vector<ZopfliNode> nodes(num_bytes + 1);
  nodes[0].length = 0;
  nodes[0].cost = 0;
  memcpy(nodes[0].distance_cache, dist_cache, 4 * sizeof(dist_cache[0]));

  StartPosQueue queue(3);
  const double min_cost_cmd = model.GetMinCostCmd();

  size_t cur_match_pos = 0;
  for (size_t i = 0; i + 3 < num_bytes; i++) {
    size_t cur_ix = position + i;
    size_t cur_ix_masked = cur_ix & ringbuffer_mask;
    size_t max_distance = std::min(cur_ix, max_backward_limit);
    size_t max_length = num_bytes - i;

    queue.Push(i, nodes[i].cost - model.GetLiteralCosts(0, i));

    const size_t min_len = ComputeMinimumCopyLength(queue, nodes, model,
                                                    i, min_cost_cmd);

    // Go over the command starting positions in order of increasing cost
    // difference.
    for (size_t k = 0; k < 5 && k < queue.size(); ++k) {
      const size_t start = queue.GetStartPos(k);
      const double start_costdiff =
          nodes[start].cost - model.GetLiteralCosts(0, start);
      const int* dist_cache2 = &nodes[start].distance_cache[0];

      // Look for last distance matches using the distance cache from this
      // starting position.
      size_t best_len = min_len - 1;
      for (size_t j = 0; j < kNumDistanceShortCodes; ++j) {
        const size_t idx = kDistanceCacheIndex[j];
        const size_t backward =
            static_cast<size_t>(dist_cache2[idx] + kDistanceCacheOffset[j]);
        size_t prev_ix = cur_ix - backward;
        if (prev_ix >= cur_ix) {
          continue;
        }
        if (PREDICT_FALSE(backward > max_distance)) {
          continue;
        }
        prev_ix &= ringbuffer_mask;

        if (cur_ix_masked + best_len > ringbuffer_mask ||
            prev_ix + best_len > ringbuffer_mask ||
            ringbuffer[cur_ix_masked + best_len] !=
            ringbuffer[prev_ix + best_len]) {
          continue;
        }
        const size_t len =
            FindMatchLengthWithLimit(&ringbuffer[prev_ix],
                                     &ringbuffer[cur_ix_masked],
                                     max_length);
        for (size_t l = best_len + 1; l <= len; ++l) {
          const size_t inslen = i - start;
          double cmd_cost = model.GetCommandCost(j, l, inslen);
          double cost = start_costdiff + cmd_cost + model.GetLiteralCosts(0, i);
          if (cost < nodes[i + l].cost) {
            UpdateZopfliNode(&nodes[0], i, start, l, l, backward, j,
                             max_distance, dist_cache2, cost);
          }
          best_len = l;
        }
      }

      // At higher iterations look only for new last distance matches, since
      // looking only for new command start positions with the same distances
      // does not help much.
      if (k >= 2) continue;

      // Loop through all possible copy lengths at this position.
      size_t len = min_len;
      for (size_t j = 0; j < num_matches[i]; ++j) {
        BackwardMatch match = matches[cur_match_pos + j];
        size_t dist = match.distance;
        bool is_dictionary_match = dist > max_distance;
        // We already tried all possible last distance matches, so we can use
        // normal distance code here.
        size_t dist_code = dist + 15;
        // Try all copy lengths up until the maximum copy length corresponding
        // to this distance. If the distance refers to the static dictionary, or
        // the maximum length is long enough, try only one maximum length.
        size_t max_len = match.length();
        if (len < max_len && (is_dictionary_match || max_len > kMaxZopfliLen)) {
          len = max_len;
        }
        for (; len <= max_len; ++len) {
          size_t len_code = is_dictionary_match ? match.length_code() : len;
          const size_t inslen = i - start;
          double cmd_cost = model.GetCommandCost(dist_code, len_code, inslen);
          double cost = start_costdiff + cmd_cost + model.GetLiteralCosts(0, i);
          if (cost < nodes[i + len].cost) {
            UpdateZopfliNode(&nodes[0], i, start, len, len_code, dist,
                             dist_code, max_distance, dist_cache2, cost);
          }
        }
      }
    }

    cur_match_pos += num_matches[i];

    // The zopflification can be too slow in case of very long lengths, so in
    // such case skip it all, it does not cost a lot of compression ratio.
    if (num_matches[i] == 1 &&
        matches[cur_match_pos - 1].length() > kMaxZopfliLen) {
      i += matches[cur_match_pos - 1].length() - 1;
      queue.Clear();
    }
  }

  std::vector<uint32_t> backwards;
  size_t index = num_bytes;
  while (nodes[index].cost == kInfinity) --index;
  while (index != 0) {
    size_t len = nodes[index].length + nodes[index].insert_length;
    backwards.push_back(static_cast<uint32_t>(len));
    index -= len;
  }

  std::vector<uint32_t> path;
  for (size_t i = backwards.size(); i > 0; i--) {
    path.push_back(backwards[i - 1]);
  }

  size_t pos = 0;
  for (size_t i = 0; i < path.size(); i++) {
    const ZopfliNode& next = nodes[pos + path[i]];
    size_t copy_length = next.length;
    size_t insert_length = next.insert_length;
    pos += insert_length;
    if (i == 0) {
      insert_length += *last_insert_len;
      *last_insert_len = 0;
    }
    size_t distance = next.distance;
    size_t len_code = next.length_code;
    size_t max_distance = std::min(position + pos, max_backward_limit);
    bool is_dictionary = (distance > max_distance);
    size_t dist_code = next.distance_code;

    Command cmd(insert_length, copy_length, len_code, dist_code);
    *commands++ = cmd;

    if (!is_dictionary && dist_code > 0) {
      dist_cache[3] = dist_cache[2];
      dist_cache[2] = dist_cache[1];
      dist_cache[1] = dist_cache[0];
      dist_cache[0] = static_cast<int>(distance);
    }

    *num_literals += insert_length;
    insert_length = 0;
    pos += copy_length;
  }
  *last_insert_len += num_bytes - pos;
  *num_commands += static_cast<size_t>(commands - orig_commands);
}